

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O3

void chrono::utils::AddRoundedCylinderGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,double radius,
               double hlen,double srad,ChVector<double> *pos,ChQuaternion<double> *rot,
               bool visualization,shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  double dVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ChRoundedCylinderShape *this;
  ChBody *model;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  shared_ptr<chrono::ChRoundedCylinderShape> rcyl;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  undefined1 local_118 [24];
  undefined1 auStack_100 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  element_type *local_e8;
  ChSystem *pCStack_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  ChVisualModel *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined1 local_b8 [40];
  double local_90;
  double dStack_88;
  double local_80;
  ChMatrix33<double> local_78;
  
  peVar2 = (body->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var4 = (body->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_e8 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  pCStack_e0 = (ChSystem *)
               (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi;
  p_Var3 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vis_material;
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_b8,rot);
  (*peVar2->_vptr_ChCollisionModel[0xd])(radius,radius,hlen,srad,peVar2,&local_e8,pos,local_b8);
  if (pCStack_e0 != (ChSystem *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCStack_e0);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (visualization) {
    model = body;
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
    if ((pointer)local_b8._0_8_ == (pointer)0x0) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
      p_Var4->_M_use_count = 1;
      p_Var4->_M_weak_count = 1;
      local_118._0_8_ = p_Var4 + 1;
      p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b0bf68;
      p_Var4[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var4[1]._M_use_count = 0;
      p_Var4[1]._M_weak_count = 0;
      p_Var4[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var4[2]._M_use_count = 0;
      p_Var4[2]._M_weak_count = 0;
      p_Var4[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var4[2]._M_use_count = 0;
      p_Var4[2]._M_weak_count = 0;
      p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var4[3]._M_use_count = 0;
      p_Var4[3]._M_weak_count = 0;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = 2;
      }
      model = (ChBody *)local_118;
      local_118._8_8_ = p_Var4;
      ChPhysicsItem::AddVisualModel
                (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)model);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    this = (ChRoundedCylinderShape *)
           ChVisualShape::operator_new((ChVisualShape *)0x48,(size_t)model);
    ChRoundedCylinderShape::ChRoundedCylinderShape(this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChRoundedCylinderShape*>
              (&_Stack_120,this);
    (this->groundedcyl).rad = radius;
    (this->groundedcyl).hlen = hlen;
    (this->groundedcyl).radsphere = srad;
    auStack_100._8_8_ =
         ((__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)
         &(local_d0._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
    p_Stack_f0 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_d0._M_pi)->_M_use_count)->
                 _M_pi;
    p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_d0._M_pi)->_M_use_count)->_M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    ChVisualShape::AddMaterial
              ((ChVisualShape *)this,(shared_ptr<chrono::ChVisualMaterial> *)(auStack_100 + 8));
    if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
    }
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    auStack_100._0_8_ = _Stack_120._M_pi;
    if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_120._M_pi)->_M_use_count = (_Stack_120._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_120._M_pi)->_M_use_count = (_Stack_120._M_pi)->_M_use_count + 1;
      }
    }
    local_b8._0_8_ = &PTR__ChFrame_00b03780;
    dVar1 = pos->m_data[2];
    auVar5._8_8_ = dVar1;
    auVar5._0_8_ = dVar1;
    auVar5._16_8_ = dVar1;
    auVar5._24_8_ = dVar1;
    auVar5 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])pos->m_data),auVar5,0x30);
    dVar1 = rot->m_data[0];
    auVar6._8_8_ = dVar1;
    auVar6._0_8_ = dVar1;
    auVar6._16_8_ = dVar1;
    auVar6._24_8_ = dVar1;
    local_b8._8_32_ = vblendps_avx(auVar5,auVar6,0xc0);
    local_90 = rot->m_data[1];
    dStack_88 = rot->m_data[2];
    local_80 = rot->m_data[3];
    local_118._16_8_ = this;
    ChMatrix33<double>::ChMatrix33(&local_78,rot);
    ChVisualModel::AddShape
              (local_c8,(shared_ptr<chrono::ChVisualShape> *)(local_118 + 0x10),
               (ChFrame<double> *)local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_100._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_100._0_8_);
    }
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
    }
  }
  return;
}

Assistant:

void AddRoundedCylinderGeometry(ChBody* body,
                                std::shared_ptr<ChMaterialSurface> material,
                                double radius,
                                double hlen,
                                double srad,
                                const ChVector<>& pos,
                                const ChQuaternion<>& rot,
                                bool visualization,
                                std::shared_ptr<ChVisualMaterial> vis_material) {
    body->GetCollisionModel()->AddRoundedCylinder(material, radius, radius, hlen, srad, pos, rot);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto rcyl = chrono_types::make_shared<ChRoundedCylinderShape>();
        rcyl->GetRoundedCylinderGeometry().rad = radius;
        rcyl->GetRoundedCylinderGeometry().hlen = hlen;
        rcyl->GetRoundedCylinderGeometry().radsphere = srad;
        rcyl->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(rcyl, ChFrame<>(pos, rot));
    }
}